

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *format,char *format_max,ImGuiSliderFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  char *text_end;
  float fVar5;
  float min_min;
  float max_max;
  float max_min;
  float min_max;
  float local_6c;
  char *local_68;
  float *local_60;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_68 = format_max;
    local_48 = v_min;
    PushID(label);
    BeginGroup();
    fVar5 = CalcItemWidth();
    PushMultiItemsWidths(2,fVar5);
    local_6c = (float)(~-(uint)(v_max <= local_48) & (uint)local_48 |
                      -(uint)(v_max <= local_48) & 0xff7fffff);
    fVar5 = *v_current_max;
    local_4c = fVar5;
    if ((local_48 < v_max) && (local_4c = v_max, fVar5 <= v_max)) {
      local_4c = fVar5;
    }
    local_60 = v_current_max;
    bVar3 = DragScalar("##min",8,v_current_min,v_speed,&local_6c,&local_4c,format,
                       (-(uint)(local_6c == local_4c) & 1) << 0x15 | flags);
    PopItemWidth();
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    local_50 = *v_current_min;
    if (v_max <= local_48) {
      v_max = 3.4028235e+38;
    }
    else {
      local_50 = (float)(~-(uint)(local_50 <= local_48) & (uint)local_50 |
                        (uint)local_48 & -(uint)(local_50 <= local_48));
    }
    if (local_68 != (char *)0x0) {
      format = local_68;
    }
    local_54 = v_max;
    bVar4 = DragScalar("##max",8,local_60,v_speed,&local_50,&local_54,format,
                       (-(uint)(local_50 == v_max) & 1) << 0x15 | flags);
    bVar3 = bVar3 || bVar4;
    PopItemWidth();
    SameLine(0.0,(pIVar2->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();
    return value_changed;
}